

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void formatFailMessage<QStringView,QLatin1String>
               (char *msg,size_t maxMsgLen,char *failureMsg,QStringView *val1,QLatin1String *val2,
               char *actual,char *expected,ComparisonOperation op)

{
  storage_type *psVar1;
  char *val1_00;
  storage_type *psVar2;
  char *pcVar3;
  storage_type_conflict *extraout_RDX;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QByteArrayView QVar4;
  QArrayData *local_50;
  qsizetype local_48;
  QTest *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  string.m_data = (storage_type_conflict *)failureMsg;
  string.m_size = (qsizetype)val1;
  val1_00 = QTest::toPrettyUnicode((QTest *)failureMsg,string);
  psVar1 = (storage_type *)val2->m_size;
  pcVar3 = val2->m_data;
  psVar2 = (storage_type *)0x0;
  if (0 < (long)psVar1) {
    psVar2 = psVar1;
  }
  if (pcVar3 == (char *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  if (pcVar3 != (char *)0x0 && (long)psVar1 < 0) {
    psVar2 = (storage_type *)strlen(pcVar3);
  }
  QVar4.m_data = psVar2;
  QVar4.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar4);
  string_00.m_data = extraout_RDX;
  string_00.m_size = local_48;
  pcVar3 = QTest::toPrettyUnicode(local_40,string_00);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  formatFailMessage(msg,0x1000,(char *)maxMsgLen,val1_00,pcVar3,actual,expected,CustomCompare);
  if (val1_00 != (char *)0x0) {
    operator_delete__(val1_00);
  }
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const Actual &val1, const Expected &val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const char *val1S = QTest::toString(val1);
    const char *val2S = QTest::toString(val2);

    formatFailMessage(msg, maxMsgLen, failureMsg, val1S, val2S, actual, expected, op);

    delete [] val1S;
    delete [] val2S;
}